

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::handleSwitchAttributes
          (HlslParseContext *this,TSourceLoc *loc,TIntermSwitch *selection,TAttributes *attributes)

{
  bool bVar1;
  pointer pTVar2;
  _Self local_38;
  _Self local_30;
  const_iterator it;
  TAttributes *attributes_local;
  TIntermSwitch *selection_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  if (selection != (TIntermSwitch *)0x0) {
    it._M_node = (_List_node_base *)attributes;
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>::begin
                   (&attributes->
                     super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                   );
    while( true ) {
      local_38._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>::end
                     (it._M_node);
      bVar1 = std::operator!=(&local_30,&local_38);
      if (!bVar1) break;
      pTVar2 = std::_List_const_iterator<glslang::TAttributeArgs>::operator->(&local_30);
      if (pTVar2->name == EatBranch) {
        TIntermSwitch::setDontFlatten(selection);
      }
      else if (pTVar2->name == EatFlatten) {
        TIntermSwitch::setFlatten(selection);
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                  (this,loc,"attribute does not apply to a switch","");
      }
      std::_List_const_iterator<glslang::TAttributeArgs>::operator++(&local_30);
    }
  }
  return;
}

Assistant:

void HlslParseContext::handleSwitchAttributes(const TSourceLoc& loc, TIntermSwitch* selection,
    const TAttributes& attributes)
{
    if (selection == nullptr)
        return;

    for (auto it = attributes.begin(); it != attributes.end(); ++it) {
        switch (it->name) {
        case EatFlatten:
            selection->setFlatten();
            break;
        case EatBranch:
            selection->setDontFlatten();
            break;
        default:
            warn(loc, "attribute does not apply to a switch", "", "");
            break;
        }
    }
}